

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::RandomWalkIntegrator::LiRandomWalk
          (RandomWalkIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,int depth)

{
  long lVar1;
  ulong uVar2;
  pointer pLVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float afVar12 [4];
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ImageInfiniteLight *this_00;
  pointer pLVar16;
  HaltonSampler *this_01;
  DebugMLTSampler *this_02;
  int dimension;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar20 [16];
  undefined1 auVar23 [64];
  undefined1 auVar37 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar34 [64];
  undefined1 auVar36 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar45 [56];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar44 [64];
  float fVar46;
  undefined4 uVar47;
  SampledSpectrum SVar48;
  SampledSpectrum SVar49;
  Vector3f w;
  Vector3f woRender;
  Vector3f wiRender;
  SampledSpectrum beta;
  BSDF bsdf;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  undefined1 local_2a8 [16];
  Tuple3<pbrt::Vector3,_float> local_288;
  undefined1 local_278 [16];
  undefined1 local_268 [4];
  float afStack_264 [5];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_250;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_248;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_240;
  RayDifferential local_238;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1d8;
  ulong local_d8;
  BSDF local_d0;
  RayDifferential local_98;
  undefined1 auVar35 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 auVar43 [64];
  
  *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
  if (((this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate.
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       .bits & 0xffffffffffff) == 0) {
    local_d8 = 0;
    local_1d8._192_8_ = 0;
    local_1d8._200_8_ = 0;
    local_1d8._208_8_ = 0;
    local_1d8._216_8_ = 0;
    local_1d8._224_8_ = 0;
    local_1d8._232_8_ = 0;
    local_1d8._240_8_ = 0;
    local_1d8._248_8_ = 0;
    local_1d8._128_8_ = 0;
    local_1d8._136_8_ = 0;
    local_1d8._144_8_ = 0;
    local_1d8._152_8_ = 0;
    local_1d8._160_8_ = 0;
    local_1d8._168_8_ = 0;
    local_1d8._176_8_ = 0;
    local_1d8._184_8_ = 0;
    local_1d8._64_8_ = 0;
    local_1d8._72_8_ = 0;
    local_1d8._80_8_ = 0;
    local_1d8._88_8_ = 0;
    local_1d8._96_8_ = 0;
    local_1d8._104_8_ = 0;
    local_1d8._112_8_ = 0;
    local_1d8._120_8_ = 0;
    local_1d8.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1d8._8_8_ = 0;
    local_1d8._16_8_ = 0;
    local_1d8._24_8_ = 0;
    local_1d8._32_8_ = 0;
    local_1d8._40_8_ = 0;
    local_1d8._48_8_ = 0;
    local_1d8._56_8_ = 0;
  }
  else {
    PrimitiveHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_1d8.__align,
               &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate,
               &ray->super_Ray,INFINITY);
    if ((local_d8 & 1) != 0) {
      uVar14._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar14._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      w.super_Tuple3<pbrt::Vector3,_float>.z =
           -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = uVar14 ^ 0x8000000080000000;
      auVar20._8_4_ = 0x80000000;
      auVar20._12_4_ = 0x80000000;
      w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar20._0_8_;
      w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar20._0_8_ >> 0x20);
      uStack_2c0 = auVar20._8_8_;
      SVar48 = SurfaceInteraction::Le((SurfaceInteraction *)&local_1d8.__align,w,lambda);
      local_2c8 = (undefined1  [8])SVar48.values.values._0_8_;
      local_2a8._8_8_ = local_2a8._0_8_;
      local_2a8._0_8_ = SVar48.values.values._8_8_;
      if (this->maxDepth == depth) {
        return (SampledSpectrum)(undefined1  [16])SVar48.values.values;
      }
      local_240.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_248.bits =
           (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      SurfaceInteraction::GetBSDF
                (&local_d0,(SurfaceInteraction *)&local_1d8.__align,ray,lambda,
                 (CameraHandle *)&local_240,scratchBuffer,(SamplerHandle *)&local_248);
      if (((ulong)local_d0.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                  .bits & 0xffffffffffff) == 0) {
        return (SampledSpectrum)(undefined1  [16])SVar48.values.values;
      }
      uVar14 = (sampler->
               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
      uVar5 = (ushort)(uVar14 >> 0x30);
      uVar13 = (uint)uVar5;
      if (uVar14 >> 0x30 < 5) {
        if (uVar13 < 3) {
          if (uVar13 == 2) {
            auVar23._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar14 & 0xffffffffffff))
            ;
            auVar23._8_56_ = extraout_var_01;
            auVar20 = auVar23._0_16_;
          }
          else {
            auVar30._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar14 & 0xffffffffffff));
            auVar30._8_56_ = extraout_var_04;
            auVar20 = auVar30._0_16_;
          }
        }
        else {
          this_01 = (HaltonSampler *)(uVar14 & 0xffffffffffff);
          if ((uVar13 & 6) == 2) {
            dimension = 2;
            if (this_01->dimension < 999) {
              dimension = this_01->dimension;
            }
            this_01->dimension = dimension + 2;
            local_2d8._0_4_ = HaltonSampler::SampleDimension(this_01,dimension);
            local_2d8._4_4_ = extraout_XMM0_Db;
            local_2d8._8_4_ = extraout_XMM0_Dc;
            local_2d8._12_4_ = extraout_XMM0_Dd;
            auVar28._0_4_ = HaltonSampler::SampleDimension(this_01,dimension + 1);
            auVar28._4_60_ = extraout_var;
            auVar20 = auVar28._0_16_;
LAB_003ee5d2:
            auVar20 = vinsertps_avx(local_2d8,auVar20,0x10);
          }
          else {
            auVar32._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_01);
            auVar32._8_56_ = extraout_var_06;
            auVar20 = auVar32._0_16_;
          }
        }
      }
      else {
        uVar15 = uVar5 - 4;
        if (uVar15 < 3) {
          if (uVar15 == 2) {
            auVar27._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar14 & 0xffffffffffff));
            auVar27._8_56_ = extraout_var_02;
            auVar20 = auVar27._0_16_;
          }
          else {
            auVar31._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar14 & 0xffffffffffff));
            auVar31._8_56_ = extraout_var_05;
            auVar20 = auVar31._0_16_;
          }
        }
        else {
          this_02 = (DebugMLTSampler *)(uVar14 & 0xffffffffffff);
          if (uVar13 - 6 < 2) {
            auVar29._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_02);
            auVar29._8_56_ = extraout_var_03;
            auVar20 = auVar29._0_16_;
          }
          else {
            if (uVar13 - 6 != 2) {
              local_2d8._0_4_ = DebugMLTSampler::Get1D(this_02);
              local_2d8._4_4_ = extraout_XMM0_Db_00;
              local_2d8._8_4_ = extraout_XMM0_Dc_00;
              local_2d8._12_4_ = extraout_XMM0_Dd_00;
              auVar34._0_4_ = DebugMLTSampler::Get1D(this_02);
              auVar34._4_60_ = extraout_var_00;
              auVar20 = auVar34._0_16_;
              goto LAB_003ee5d2;
            }
            auVar33._0_8_ = MLTSampler::Get2D((MLTSampler *)this_02);
            auVar33._8_56_ = extraout_var_07;
            auVar20 = auVar33._0_16_;
          }
        }
      }
      auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar20,
                                SUB6416(ZEXT464(0x3f800000),0));
      auVar4 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar17,auVar17);
      fVar46 = auVar17._0_4_;
      auVar17 = vmaxss_avx(auVar4,ZEXT816(0) << 0x20);
      auVar17 = vsqrtss_avx(auVar17,auVar17);
      auVar20 = vmovshdup_avx(auVar20);
      fVar19 = auVar20._0_4_ * 6.2831855;
      fVar18 = cosf(fVar19);
      local_278 = ZEXT416((uint)(fVar18 * auVar17._0_4_));
      fVar19 = sinf(fVar19);
      auVar17 = ZEXT416((uint)(fVar19 * auVar17._0_4_));
      auVar20 = vinsertps_avx(local_278,auVar17,0x10);
      local_288._0_8_ = vmovlps_avx(auVar20);
      uVar2._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar2._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar21._0_8_ = uVar2 ^ 0x8000000080000000;
      auVar21._8_4_ = 0x80000000;
      auVar21._12_4_ = 0x80000000;
      auVar38._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar38._4_4_ = 0x80000000;
      auVar38._8_4_ = 0x80000000;
      auVar38._12_4_ = 0x80000000;
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar38._0_4_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar21._0_8_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar21._0_8_ >> 0x20);
      auVar45 = ZEXT856(auVar38._8_8_);
      auVar37 = ZEXT856(auVar21._8_8_);
      wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar20._0_8_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar46;
      local_288.z = fVar46;
      SVar49 = BSDF::f(&local_d0,woRender,wiRender,Radiance);
      auVar43._0_8_ = SVar49.values.values._8_8_;
      auVar43._8_56_ = auVar45;
      auVar35._0_8_ = SVar49.values.values._0_8_;
      auVar35._8_56_ = auVar37;
      auVar20 = vmovlhps_avx(auVar35._0_16_,auVar43._0_16_);
      auVar17 = vfmadd132ss_fma(auVar17,ZEXT416((uint)((float)local_1d8._136_4_ * fVar46)),
                                ZEXT416((uint)local_1d8._132_4_));
      auVar4 = vfmsub213ss_fma(ZEXT416((uint)fVar46),ZEXT416((uint)local_1d8._136_4_),
                               ZEXT416((uint)((float)local_1d8._136_4_ * fVar46)));
      auVar17 = vfmadd132ss_fma(local_278,ZEXT416((uint)(auVar17._0_4_ + auVar4._0_4_)),
                                ZEXT416((uint)local_1d8._128_4_));
      uVar47 = auVar17._0_4_;
      auVar39._4_4_ = uVar47;
      auVar39._0_4_ = uVar47;
      auVar39._8_4_ = uVar47;
      auVar39._12_4_ = uVar47;
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl(auVar39,auVar17);
      auVar22._0_4_ = auVar17._0_4_ * auVar20._0_4_;
      auVar22._4_4_ = auVar17._4_4_ * auVar20._4_4_;
      auVar22._8_4_ = auVar17._8_4_ * auVar20._8_4_;
      auVar22._12_4_ = auVar17._12_4_ * auVar20._12_4_;
      auVar4._8_4_ = 0x3da2f983;
      auVar4._0_8_ = 0x3da2f9833da2f983;
      auVar4._12_4_ = 0x3da2f983;
      _local_268 = vdivps_avx512vl(auVar22,auVar4);
      if ((local_268 == 0.0) && (!NAN(local_268))) {
        uVar14 = 0xffffffffffffffff;
        do {
          if (uVar14 == 2) {
            return (SampledSpectrum)(undefined1  [16])SVar48.values.values;
          }
          lVar1 = uVar14 * 4;
          uVar14 = uVar14 + 1;
        } while ((*(float *)(local_268 + lVar1 + 8) == 0.0) &&
                (!NAN(*(float *)(local_268 + lVar1 + 8))));
        if (2 < uVar14) {
          return (SampledSpectrum)(undefined1  [16])SVar48.values.values;
        }
      }
      Interaction::SpawnRay(&local_238,(Interaction *)&local_1d8.__align,(Vector3f *)&local_288);
      (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
           local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
      (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
           local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
      *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
           local_238.super_Ray._20_8_;
      (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
           local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
      (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
           local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
      *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
           CONCAT44(local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x,
                    local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z);
      (ray->super_Ray).medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (uintptr_t)
              local_238.super_Ray.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
      (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           local_238.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x;
      (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           local_238.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y;
      *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_238._76_8_;
      (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           local_238.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y;
      (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           local_238.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
      ray->hasDifferentials = local_238.hasDifferentials;
      *(undefined3 *)&ray->field_0x29 = local_238._41_3_;
      (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x =
           local_238.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
      (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           local_238.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
      (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           local_238.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x =
           local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
      *(ulong *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           CONCAT44(local_238.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x,
                    local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z);
      local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
           (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
      local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
           (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
      uVar10 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar11 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      local_98.super_Ray._20_8_ =
           *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
           (float)*(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
      local_98.super_Ray.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = local_238.super_Ray.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      local_98.hasDifferentials = ray->hasDifferentials;
      local_98._41_3_ = *(undefined3 *)&ray->field_0x29;
      local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
           (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
      local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
           (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
      local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
           (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
      uVar6 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
      uVar7 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
      uVar8 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
      uVar9._0_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar9._4_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
      local_98._76_8_ = *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
      local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
           (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
      local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
      local_250.bits =
           (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      auVar37 = ZEXT856((ulong)local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>._4_8_);
      auVar45 = ZEXT856(uVar9);
      local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar10;
      local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar11;
      local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar6;
      local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar7;
      local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar8;
      local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uVar9;
      local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar9._4_4_;
      SVar48 = LiRandomWalk(this,&local_98,lambda,(SamplerHandle *)&local_250,scratchBuffer,
                            depth + 1);
      auVar44._0_8_ = SVar48.values.values._8_8_;
      auVar44._8_56_ = auVar45;
      auVar36._0_8_ = SVar48.values.values._0_8_;
      auVar36._8_56_ = auVar37;
      auVar20 = vmovlhps_avx(auVar36._0_16_,auVar44._0_16_);
      auVar17 = vunpcklpd_avx(_local_2c8,local_2a8);
      local_2c8._0_4_ = auVar20._0_4_ * (float)local_268 + auVar17._0_4_;
      local_2c8._4_4_ = auVar20._4_4_ * afStack_264[0] + auVar17._4_4_;
      uStack_2c0._0_4_ = auVar20._8_4_ * afStack_264[1] + auVar17._8_4_;
      uStack_2c0._4_4_ = auVar20._12_4_ * afStack_264[2] + auVar17._12_4_;
      auVar20 = vshufpd_avx(_local_2c8,_local_2c8,1);
      goto LAB_003ee7f8;
    }
  }
  pLVar16 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.infiniteLights.
            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar3 = *(pointer *)
            ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                    infiniteLights.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data + 8);
  auVar20 = ZEXT816(0) << 0x40;
  _local_2c8 = auVar20;
  if (pLVar16 != pLVar3) {
    do {
      uVar14 = (pLVar16->
               super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               ).bits;
      auVar20 = ZEXT816(0) << 0x40;
      auVar17 = ZEXT816(0) << 0x40;
      uVar13 = (uint)(ushort)(uVar14 >> 0x30);
      if (6 < uVar13) {
        uVar13 = uVar13 - 6;
        this_00 = (ImageInfiniteLight *)(uVar14 & 0xffffffffffff);
        if (uVar13 < 2) {
          auVar37 = ZEXT856(0);
          auVar45 = ZEXT856(0);
          SVar48 = UniformInfiniteLight::Le((UniformInfiniteLight *)this_00,&ray->super_Ray,lambda);
          auVar40._0_8_ = SVar48.values.values._8_8_;
          auVar40._8_56_ = auVar45;
          auVar17 = auVar40._0_16_;
          auVar24._0_8_ = SVar48.values.values._0_8_;
          auVar24._8_56_ = auVar37;
          auVar20 = auVar24._0_16_;
        }
        else if (uVar13 == 2) {
          auVar37 = ZEXT856(0);
          auVar45 = ZEXT856(0);
          SVar48 = ImageInfiniteLight::Le(this_00,&ray->super_Ray,lambda);
          auVar41._0_8_ = SVar48.values.values._8_8_;
          auVar41._8_56_ = auVar45;
          auVar17 = auVar41._0_16_;
          auVar25._0_8_ = SVar48.values.values._0_8_;
          auVar25._8_56_ = auVar37;
          auVar20 = auVar25._0_16_;
        }
        else {
          auVar37 = ZEXT856(0);
          auVar45 = ZEXT856(0);
          SVar48 = PortalImageInfiniteLight::Le
                             ((PortalImageInfiniteLight *)this_00,&ray->super_Ray,lambda);
          auVar42._0_8_ = SVar48.values.values._8_8_;
          auVar42._8_56_ = auVar45;
          auVar17 = auVar42._0_16_;
          auVar26._0_8_ = SVar48.values.values._0_8_;
          auVar26._8_56_ = auVar37;
          auVar20 = auVar26._0_16_;
        }
      }
      auVar20 = vmovlhps_avx(auVar20,auVar17);
      pLVar16 = pLVar16 + 1;
      local_2c8._4_4_ = auVar20._4_4_ + (float)local_2c8._4_4_;
      local_2c8._0_4_ = auVar20._0_4_ + (float)local_2c8._0_4_;
      uStack_2c0._0_4_ = auVar20._8_4_ + (float)uStack_2c0;
      uStack_2c0._4_4_ = auVar20._12_4_ + uStack_2c0._4_4_;
    } while (pLVar16 != pLVar3);
    auVar20 = vpermilpd_avx(_local_2c8,1);
  }
LAB_003ee7f8:
  afVar12[2] = (float)(int)auVar20._0_8_;
  afVar12[3] = (float)(int)((ulong)auVar20._0_8_ >> 0x20);
  afVar12[0] = (float)local_2c8._0_4_;
  afVar12[1] = (float)local_2c8._4_4_;
  return (array<float,_4>)(array<float,_4>)afVar12;
}

Assistant:

SampledSpectrum LiRandomWalk(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 int depth) const {
        SampledSpectrum L(0.f);
        // Intersect ray with scene and return if no intersection
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (!si) {
            // Return emitted light from infinite light sources
            for (LightHandle light : infiniteLights)
                L += light.Le(ray, lambda);
            return L;
        }
        SurfaceInteraction &isect = si->intr;

        // Get emitted radiance at surface intersection
        L = isect.Le(-ray.d, lambda);

        // Terminate random walk if maximum depth has been reached
        if (depth == maxDepth)
            return L;

        // Compute BSDF at random walk intersection point
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf)
            return L;

        // Randomly sample direction leaving surface for random walk
        Point2f u = sampler.Get2D();
        Vector3f wi = SampleUniformSphere(u);

        // Evaluate BSDF at surface for sampled direction
        Vector3f wo = -ray.d;
        SampledSpectrum beta =
            bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / (1 / (4 * Pi));
        if (!beta)
            return L;

        // Recursively trace ray to estimate incident radiance at surface
        ray = isect.SpawnRay(wi);
        return L + beta * LiRandomWalk(ray, lambda, sampler, scratchBuffer, depth + 1);
    }